

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitterPrivate::recalc(QSplitterPrivate *this,bool update)

{
  QSplitterLayoutStruct *pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Int IVar6;
  qsizetype qVar7;
  const_reference ppQVar8;
  Int *pIVar9;
  QSplitter *pQVar10;
  byte in_SIL;
  QSplitterPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar11;
  QSplitterLayoutStruct *s_2;
  int j;
  bool empty;
  int minl;
  int fi;
  QSplitterLayoutStruct *s_1;
  int i_1;
  bool widgetHidden;
  QSplitterLayoutStruct *s;
  int i;
  bool allInvisible;
  bool first;
  int n;
  QSplitter *q;
  int tm;
  QSize minS;
  int mint;
  int maxt;
  int maxl;
  undefined4 in_stack_ffffffffffffff38;
  Orientation in_stack_ffffffffffffff3c;
  QSplitterPrivate *in_stack_ffffffffffffff40;
  int local_90;
  QFlagsStorage<Qt::AlignmentFlag> align;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int local_64;
  undefined7 in_stack_ffffffffffffffb0;
  int local_40;
  undefined1 local_3c [4];
  QSize local_38;
  int local_30;
  int local_2c;
  undefined1 local_28 [4];
  QSize local_24;
  QSize local_1c;
  Int local_14;
  Int local_10;
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  q_func(in_RDI);
  qVar7 = QList<QSplitterLayoutStruct_*>::size(&in_RDI->list);
  iVar4 = (int)qVar7;
  bVar11 = iVar4 != 0;
  for (local_64 = 0; local_64 < iVar4; local_64 = local_64 + 1) {
    ppQVar8 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pQVar1 = *ppQVar8;
    bVar3 = QWidget::isHidden((QWidget *)0x699c5e);
    in_stack_ffffffffffffff8c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff8c);
    if (((bVar11) && (!bVar3)) && ((pQVar1->field_0x14 & 1) == 0)) {
      bVar11 = false;
    }
    QWidget::setHidden((QWidget *)in_stack_ffffffffffffff40,
                       SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
  }
  if (bVar11) {
    for (in_stack_ffffffffffffff88 = 0; in_stack_ffffffffffffff88 < iVar4;
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1) {
      ppQVar8 = QList<QSplitterLayoutStruct_*>::at
                          ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffff40,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      pQVar1 = *ppQVar8;
      bVar11 = QWidget::isHidden((QWidget *)0x699d23);
      if (!bVar11) {
        pQVar1->field_0x14 = pQVar1->field_0x14 & 0xfe;
        break;
      }
    }
  }
  iVar5 = QFrame::frameWidth((QFrame *)in_stack_ffffffffffffff40);
  IVar6 = iVar5 << 1;
  local_10 = 0xffffff;
  bVar11 = true;
  align.i = IVar6;
  local_14 = IVar6;
  local_c = IVar6;
  for (local_90 = 0; local_90 < iVar4; local_90 = local_90 + 1) {
    ppQVar8 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pQVar1 = *ppQVar8;
    bVar3 = QWidget::isHidden((QWidget *)0x699dcb);
    if (!bVar3) {
      bVar11 = false;
      bVar3 = QWidget::isHidden((QWidget *)0x699de6);
      if (!bVar3) {
        iVar5 = QSplitterLayoutStruct::getHandleSize
                          ((QSplitterLayoutStruct *)in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff3c);
        IVar6 = iVar5 + IVar6;
        iVar5 = QSplitterLayoutStruct::getHandleSize
                          ((QSplitterLayoutStruct *)in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff3c);
        local_c = iVar5 + local_c;
      }
      local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_1c = qSmartMinSize((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      iVar5 = pick(in_stack_ffffffffffffff40,
                   (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      IVar6 = iVar5 + IVar6;
      in_stack_ffffffffffffff40 = (QSplitterPrivate *)pQVar1->widget;
      memset(local_28,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x699e9a);
      local_24 = qSmartMaxSize((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (Alignment)align.i);
      iVar5 = pick(in_stack_ffffffffffffff40,
                   (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_c = iVar5 + local_c;
      local_2c = trans(in_stack_ffffffffffffff40,
                       (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      pIVar9 = (Int *)qMax<int>((int *)&local_14,&local_2c);
      local_14 = *pIVar9;
      memset(local_3c,0,4);
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x699f39);
      local_38 = qSmartMaxSize((QWidget *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (Alignment)align.i);
      local_30 = trans(in_stack_ffffffffffffff40,
                       (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (0 < local_30) {
        pIVar9 = (Int *)qMin<int>((int *)&local_10,&local_30);
        local_10 = *pIVar9;
      }
    }
  }
  if (bVar11) {
    pQVar10 = qobject_cast<QSplitter*>((QObject *)0x699fbc);
    if (pQVar10 == (QSplitter *)0x0) {
      local_c = 0xffffff;
    }
    else {
      local_10 = 0;
      local_c = 0;
    }
  }
  else {
    local_40 = 0xffffff;
    pIVar9 = (Int *)qMin<int>((int *)&local_c,&local_40);
    local_c = *pIVar9;
  }
  if ((int)local_10 < (int)local_14) {
    local_10 = local_14;
  }
  if ((bVar2 & 1) == 0) {
    *(uint *)&in_RDI->field_0x2a4 = *(uint *)&in_RDI->field_0x2a4 & 0xffff00ff | 0x100;
  }
  else {
    if (in_RDI->orient == Horizontal) {
      QWidget::setMaximumSize
                ((QWidget *)CONCAT44(align.i,IVar6),in_stack_ffffffffffffff8c,
                 in_stack_ffffffffffffff88);
      bVar11 = QWidget::isWindow((QWidget *)in_stack_ffffffffffffff40);
      if (bVar11) {
        QWidget::setMinimumSize
                  ((QWidget *)CONCAT44(align.i,IVar6),in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff88);
      }
    }
    else {
      QWidget::setMaximumSize
                ((QWidget *)CONCAT44(align.i,IVar6),in_stack_ffffffffffffff8c,
                 in_stack_ffffffffffffff88);
      bVar11 = QWidget::isWindow((QWidget *)in_stack_ffffffffffffff40);
      if (bVar11) {
        QWidget::setMinimumSize
                  ((QWidget *)CONCAT44(align.i,IVar6),in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff88);
      }
    }
    doResize((QSplitterPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffffb0));
    QWidget::updateGeometry((QWidget *)in_stack_ffffffffffffff40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterPrivate::recalc(bool update)
{
    Q_Q(QSplitter);
    int n = list.size();
    /*
      Splitter handles before the first visible widget or right
      before a hidden widget must be hidden.
    */
    bool first = true;
    bool allInvisible = n != 0;
    for (int i = 0; i < n ; ++i) {
        QSplitterLayoutStruct *s = list.at(i);
        bool widgetHidden = s->widget->isHidden();
        if (allInvisible && !widgetHidden && !s->collapsed)
            allInvisible = false;
        s->handle->setHidden(first || widgetHidden);
        if (!widgetHidden)
            first = false;
    }

    if (allInvisible)
        for (int i = 0; i < n ; ++i) {
            QSplitterLayoutStruct *s = list.at(i);
            if (!s->widget->isHidden()) {
                s->collapsed = false;
                break;
            }
        }

    int fi = 2 * q->frameWidth();
    int maxl = fi;
    int minl = fi;
    int maxt = QWIDGETSIZE_MAX;
    int mint = fi;
    /*
      calculate min/max sizes for the whole splitter
    */
    bool empty = true;
    for (int j = 0; j < n; j++) {
        QSplitterLayoutStruct *s = list.at(j);

        if (!s->widget->isHidden()) {
            empty = false;
            if (!s->handle->isHidden()) {
                minl += s->getHandleSize(orient);
                maxl += s->getHandleSize(orient);
            }

            QSize minS = qSmartMinSize(s->widget);
            minl += pick(minS);
            maxl += pick(qSmartMaxSize(s->widget));
            mint = qMax(mint, trans(minS));
            int tm = trans(qSmartMaxSize(s->widget));
            if (tm > 0)
                maxt = qMin(maxt, tm);
        }
    }

    if (empty) {
        if (qobject_cast<QSplitter *>(parent)) {
            // nested splitters; be nice
            maxl = maxt = 0;
        } else {
            // QSplitter with no children yet
            maxl = QWIDGETSIZE_MAX;
        }
    } else {
        maxl = qMin<int>(maxl, QWIDGETSIZE_MAX);
    }
    if (maxt < mint)
        maxt = mint;

    if (update) {
        if (orient == Qt::Horizontal) {
            q->setMaximumSize(maxl, maxt);
            if (q->isWindow())
                q->setMinimumSize(minl,mint);
        } else {
            q->setMaximumSize(maxt, maxl);
            if (q->isWindow())
                q->setMinimumSize(mint,minl);
        }
        doResize();
        q->updateGeometry();
    } else {
        firstShow = true;
    }
}